

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bpp-bare.c
# Opt level: O0

void ssh2_bare_bpp_format_packet(ssh2_bare_bpp_state *s,PktOut *pkt)

{
  int type;
  LogContext *ctx;
  int n_blanks;
  char *texttype;
  undefined1 local_68 [4];
  int nblanks;
  logblank_t blanks [4];
  ptrlen pktdata;
  PktOut *pkt_local;
  ssh2_bare_bpp_state *s_local;
  
  if ((s->bpp).logctx != (LogContext *)0x0) {
    join_0x00000010_0x00000000_ = make_ptrlen(pkt->data + 5,pkt->length - 5);
    n_blanks = ssh2_censor_packet((s->bpp).pls,pkt->type,true,join_0x00000010_0x00000000_,
                                  (logblank_t *)local_68);
    ctx = (s->bpp).logctx;
    type = pkt->type;
    texttype = ssh2_pkt_type(((s->bpp).pls)->kctx,((s->bpp).pls)->actx,pkt->type);
    log_packet(ctx,1,type,texttype,(void *)blanks[3]._4_8_,(size_t)pktdata.ptr,n_blanks,
               (logblank_t *)local_68,&s->outgoing_sequence,pkt->downstream_id,
               pkt->additional_log_text);
  }
  s->outgoing_sequence = s->outgoing_sequence + 1;
  PUT_32BIT_MSB_FIRST(pkt->data,(int)pkt->length - 4);
  bufchain_add((s->bpp).out_raw,pkt->data,pkt->length);
  return;
}

Assistant:

static void ssh2_bare_bpp_format_packet(struct ssh2_bare_bpp_state *s,
                                        PktOut *pkt)
{
    if (s->bpp.logctx) {
        ptrlen pktdata = make_ptrlen(pkt->data + 5, pkt->length - 5);
        logblank_t blanks[MAX_BLANKS];
        int nblanks = ssh2_censor_packet(
            s->bpp.pls, pkt->type, true, pktdata, blanks);
        log_packet(s->bpp.logctx, PKT_OUTGOING, pkt->type,
                   ssh2_pkt_type(s->bpp.pls->kctx, s->bpp.pls->actx,
                                 pkt->type),
                   pktdata.ptr, pktdata.len, nblanks, blanks,
                   &s->outgoing_sequence,
                   pkt->downstream_id, pkt->additional_log_text);
    }

    s->outgoing_sequence++;        /* only for diagnostics, really */

    PUT_32BIT_MSB_FIRST(pkt->data, pkt->length - 4);
    bufchain_add(s->bpp.out_raw, pkt->data, pkt->length);
}